

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void parser_eat_newline(VrplibParser *p)

{
  _Bool _Var1;
  bool bVar2;
  VrplibParser *p_local;
  
  parser_eat_whitespaces(p);
  while( true ) {
    _Var1 = parser_is_eof(p);
    bVar2 = false;
    if ((!_Var1) && (bVar2 = true, *p->at != '\r')) {
      bVar2 = *p->at == '\n';
    }
    if (!bVar2) break;
    if (*p->at == '\r') {
      parser_adv(p,1);
      _Var1 = parser_is_eof(p);
      if ((!_Var1) && (*p->at == '\n')) {
        parser_adv(p,1);
      }
      p->curline = p->curline + 1;
    }
    else {
      if (*p->at != '\n') {
        __assert_fail("*p->at == \'\\n\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/parser.c"
                      ,0xd6,"void parser_eat_newline(VrplibParser *)");
      }
      p->curline = p->curline + 1;
      parser_adv(p,1);
    }
  }
  return;
}

Assistant:

static void parser_eat_newline(VrplibParser *p) {
    parser_eat_whitespaces(p);

    while (!parser_is_eof(p) && (*p->at == '\r' || *p->at == '\n')) {
        if (*p->at == '\r') {
            parser_adv(p, 1);
            if (!parser_is_eof(p) && (*p->at == '\n')) {
                parser_adv(p, 1);
            }
            p->curline += 1;
        } else {
            assert(*p->at == '\n');
            p->curline += 1;
            parser_adv(p, 1);
        }
    }
}